

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionAnalyzer.cpp
# Opt level: O2

void __thiscall
wasm::anon_unknown_239::Hasher::Hasher
          (Hasher *this,Expression *curr,bool visitChildren,ExprHasher *custom)

{
  _Rb_tree_header *p_Var1;
  ExpressionStack *this_00;
  size_t *digest;
  ulong uVar2;
  bool bVar3;
  Expression **ppEVar4;
  Name curr_00;
  Expression *local_38;
  Expression *curr_local;
  
  this->visitChildren = visitChildren;
  this->digest = 0;
  this->internalCounter = 0;
  p_Var1 = &(this->internalNames)._M_t._M_impl.super__Rb_tree_header;
  (this->internalNames)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->internalNames)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->internalNames)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->internalNames)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  this_00 = &this->stack;
  (this->stack).flexible.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->stack).flexible.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->stack).flexible.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->internalNames)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->stack).usedFixed = 0;
  local_38 = curr;
  SmallVector<wasm::Expression_*,_10UL>::push_back(this_00,&local_38);
  curr_00.super_IString.str._M_str = DAT_011763a8;
  curr_00.super_IString.str._M_len = DELEGATE_CALLER_TARGET;
  noteScopeName(this,curr_00);
  digest = &this->digest;
  while (((long)(this->stack).flexible.
                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->stack).flexible.
                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
                super__Vector_impl_data._M_start >> 3) + (this->stack).usedFixed != 0) {
    ppEVar4 = SmallVector<wasm::Expression_*,_10UL>::back(this_00);
    local_38 = *ppEVar4;
    SmallVector<wasm::Expression_*,_10UL>::pop_back(this_00);
    if (local_38 == (Expression *)0x0) {
      uVar2 = *digest;
      *digest = (uVar2 >> 4) + uVar2 * 0x1000 + -0x61c8864680b583eb ^ uVar2;
    }
    else {
      rehash<wasm::Expression::Id>(digest,&local_38->_id);
      uVar2 = *digest;
      *digest = (uVar2 >> 4) + uVar2 * 0x1000 + (local_38->type).id + 0x9e3779b97f4a7c15 ^ uVar2;
      bVar3 = std::function<bool_(wasm::Expression_*,_unsigned_long_&)>::operator()
                        (custom,local_38,digest);
      if (!bVar3) {
        hashExpression(this,local_38);
      }
    }
  }
  return;
}

Assistant:

Hasher(Expression* curr,
         bool visitChildren,
         ExpressionAnalyzer::ExprHasher custom)
    : visitChildren(visitChildren) {
    stack.push_back(curr);
    // DELEGATE_CALLER_TARGET is a fake target used to denote delegating to
    // the caller. Add it here to prevent the unknown name error.
    noteScopeName(DELEGATE_CALLER_TARGET);

    while (stack.size() > 0) {
      curr = stack.back();
      stack.pop_back();
      if (!curr) {
        // This was an optional child that was not present. Hash a 0 to
        // represent that.
        rehash(digest, 0);
        continue;
      }
      rehash(digest, curr->_id);
      // we often don't need to hash the type, as it is tied to other values
      // we are hashing anyhow, but there are exceptions: for example, a
      // local.get's type is determined by the function, so if we are
      // hashing only expression fragments, then two from different
      // functions may turn out the same even if the type differs. Likewise,
      // if we hash between modules, then we need to take int account
      // call_imports type, etc. The simplest thing is just to hash the
      // type for all of them.
      rehash(digest, curr->type.getID());
      // If the custom hasher handled this expr, then we have nothing to do.
      if (custom(curr, digest)) {
        continue;
      }
      // Hash the contents of the expression normally.
      hashExpression(curr);
    }
  }